

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

ImPlotPoint ValueGetter::getValue<bool,int>(void *data,int idx)

{
  ImPlotPoint IVar1;
  
  IVar1.x = (double)(int)*(char *)(*(long *)((long)data + 8) + (long)idx);
  IVar1.y = (double)*(int *)(*(long *)((long)data + 0x90) + (long)idx * 4);
  return IVar1;
}

Assistant:

static ImPlotPoint getValue(void* data, int idx) {
    const auto* this_ = static_cast<ValueGetter*>(data);
    double x, y;
    if constexpr (std::is_void<X>::value) {
      x = static_cast<double>(idx);
    } else {
      x = static_cast<double>((static_cast<X*>(this_->infoX.ptr))[idx]);
    }
    y = static_cast<double>((static_cast<Y*>(this_->infoY.ptr))[idx]);
    return ImPlotPoint(x, y);
  }